

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isLookupResultValid
               (Texture2DView *texture,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int level;
  int iVar5;
  FilterMode FVar6;
  int iVar7;
  float __x;
  float fVar8;
  float __x_00;
  undefined1 auVar9 [16];
  Vec2 local_38;
  
  __x = (float)*(undefined8 *)lodBounds->m_data;
  __x_00 = (float)((ulong)*(undefined8 *)lodBounds->m_data >> 0x20);
  fVar8 = sampler->lodThreshold;
  if (__x <= fVar8) {
    bVar1 = isLevelSampleResultValid
                      (texture->m_levels,sampler,sampler->magFilter,prec,coord,0,result);
    if (bVar1) {
      return bVar1;
    }
    if (__x_00 <= fVar8) {
      return bVar1;
    }
  }
  else if (__x_00 <= fVar8) {
    return false;
  }
  FVar6 = sampler->minFilter;
  iVar5 = texture->m_numLevels;
  iVar7 = iVar5 + -1;
  if (iVar7 < 1 || (FVar6 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) != 0) {
    if ((FVar6 == LINEAR_MIPMAP_NEAREST) || (FVar6 == NEAREST_MIPMAP_NEAREST)) {
      fVar8 = ceilf(__x + 0.5);
      iVar2 = (int)fVar8 + -1;
      iVar5 = iVar7;
      if (iVar2 < iVar7) {
        iVar5 = iVar2;
      }
      if (iVar2 < 0) {
        iVar5 = 0;
      }
      fVar8 = floorf(__x_00 + 0.5);
      iVar2 = (int)fVar8;
      if (iVar2 < iVar7) {
        iVar7 = iVar2;
      }
      if (iVar2 < 0) {
        iVar7 = 0;
      }
      do {
        FVar6 = NEAREST;
        if (iVar7 < iVar5) {
          return false;
        }
        uVar3 = sampler->minFilter - LINEAR;
        if (uVar3 < 5) {
          FVar6 = *(FilterMode *)(&DAT_0191af60 + (ulong)uVar3 * 4);
        }
        bVar1 = isLevelSampleResultValid
                          (texture->m_levels + iVar5,sampler,FVar6,prec,coord,0,result);
        iVar5 = iVar5 + 1;
      } while (!bVar1);
    }
    else {
      bVar1 = isLevelSampleResultValid(texture->m_levels,sampler,FVar6,prec,coord,0,result);
      if (!bVar1) {
        return false;
      }
    }
  }
  else {
    fVar8 = floorf(__x);
    iVar2 = (int)fVar8;
    iVar5 = iVar5 + -2;
    iVar7 = iVar5;
    if (iVar2 < iVar5) {
      iVar7 = iVar2;
    }
    if (iVar2 < 0) {
      iVar7 = 0;
    }
    fVar8 = floorf(__x_00);
    iVar2 = (int)fVar8;
    if (iVar2 < iVar5) {
      iVar5 = iVar2;
    }
    if (iVar2 < 0) {
      iVar5 = 0;
    }
    do {
      FVar6 = NEAREST;
      if (iVar5 < iVar7) {
        return false;
      }
      uVar3 = sampler->minFilter - LINEAR;
      if (uVar3 < 5) {
        FVar6 = *(FilterMode *)(&DAT_0191af60 + (ulong)uVar3 * 4);
      }
      fVar8 = (float)iVar7;
      auVar9._4_4_ = __x_00 - fVar8;
      auVar9._0_4_ = __x - fVar8;
      auVar9._8_4_ = 0.0 - fVar8;
      auVar9._12_4_ = 0.0 - fVar8;
      auVar9 = minps(_DAT_0166f150,auVar9);
      lVar4 = (long)iVar7;
      iVar7 = iVar7 + 1;
      local_38.m_data[1] = (float)(-(uint)(0.0 <= __x_00 - fVar8) & auVar9._4_4_);
      local_38.m_data[0] = (float)(-(uint)(0.0 <= __x - fVar8) & auVar9._0_4_);
      bVar1 = isMipmapLinearSampleResultValid
                        (texture->m_levels + lVar4,texture->m_levels + iVar7,sampler,FVar6,prec,
                         coord,0,&local_38,result);
    } while (!bVar1);
  }
  return true;
}

Assistant:

bool isLookupResultValid (const Texture2DView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec2& coord, const Vec2& lodBounds, const Vec4& result)
{
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	if (canBeMagnified)
	{
		if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coord, 0, result))
			return true;
	}

	if (canBeMinified)
	{
		const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
		const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
		const int	minTexLevel		= 0;
		const int	maxTexLevel		= texture.getNumLevels()-1;

		DE_ASSERT(minTexLevel <= maxTexLevel);

		if (isLinearMipmap && minTexLevel < maxTexLevel)
		{
			const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
				const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

				if (isMipmapLinearSampleResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coord, 0, Vec2(minF, maxF), result))
					return true;
			}
		}
		else if (isNearestMipmap)
		{
			// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
			//		 decision to allow floor(lod + 0.5) as well.
			const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				if (isLevelSampleResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coord, 0, result))
					return true;
			}
		}
		else
		{
			if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coord, 0, result))
				return true;
		}
	}

	return false;
}